

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYRef<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLogLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYRef<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  ImVec2 IVar3;
  int iVar4;
  ImU32 IVar5;
  uint uVar6;
  GetterXsYRef<signed_char> *pGVar7;
  TransformerLogLin *pTVar8;
  ImPlotPlot *pIVar9;
  ImDrawVert *pIVar10;
  ImDrawIdx *pIVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [12];
  ImPlotContext *pIVar14;
  ImPlotContext *pIVar15;
  int iVar16;
  ImDrawIdx IVar17;
  float fVar18;
  double dVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  pIVar14 = GImPlot;
  pGVar7 = this->Getter1;
  pTVar8 = this->Transformer;
  iVar16 = pGVar7->Count;
  dVar1 = pGVar7->YRef;
  dVar19 = log10((double)(int)pGVar7->Xs
                              [(long)(((pGVar7->Offset + prim) % iVar16 + iVar16) % iVar16) *
                               (long)pGVar7->Stride] / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar15 = GImPlot;
  pIVar9 = pIVar14->CurrentPlot;
  dVar2 = (pIVar9->XAxis).Range.Min;
  iVar16 = pTVar8->YAxis;
  pGVar7 = this->Getter2;
  pTVar8 = this->Transformer;
  iVar4 = pGVar7->Count;
  IVar3 = pIVar14->PixelRange[iVar16].Min;
  fVar21 = (float)(pIVar14->My[iVar16] * (dVar1 - pIVar9->YAxis[iVar16].Range.Min) + (double)IVar3.y
                  );
  fVar22 = (float)(pIVar14->Mx *
                   (((double)(float)(dVar19 / pIVar14->LogDenX) *
                     ((pIVar9->XAxis).Range.Max - dVar2) + dVar2) - dVar2) + (double)IVar3.x);
  dVar1 = pGVar7->YRef;
  dVar19 = log10((double)(int)pGVar7->Xs
                              [(long)(((prim + pGVar7->Offset) % iVar4 + iVar4) % iVar4) *
                               (long)pGVar7->Stride] / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar9 = pIVar15->CurrentPlot;
  dVar2 = (pIVar9->XAxis).Range.Min;
  iVar16 = pTVar8->YAxis;
  IVar3 = pIVar15->PixelRange[iVar16].Min;
  fVar18 = (float)(pIVar15->Mx *
                   (((double)(float)(dVar19 / pIVar15->LogDenX) *
                     ((pIVar9->XAxis).Range.Max - dVar2) + dVar2) - dVar2) + (double)IVar3.x);
  fVar20 = (float)(pIVar15->My[iVar16] * (dVar1 - pIVar9->YAxis[iVar16].Range.Min) + (double)IVar3.y
                  );
  auVar26._0_4_ = ~-(uint)(fVar18 <= fVar22) & (uint)fVar18;
  auVar26._4_4_ = ~-(uint)(fVar20 <= fVar21) & (uint)fVar20;
  auVar26._8_4_ = ~-(uint)(fVar22 < fVar18) & (uint)fVar18;
  auVar26._12_4_ = ~-(uint)(fVar21 < fVar20) & (uint)fVar20;
  auVar12._4_4_ = (uint)fVar21 & -(uint)(fVar20 <= fVar21);
  auVar12._0_4_ = (uint)fVar22 & -(uint)(fVar18 <= fVar22);
  auVar12._8_4_ = (uint)fVar22 & -(uint)(fVar22 < fVar18);
  auVar12._12_4_ = (uint)fVar21 & -(uint)(fVar21 < fVar20);
  auVar26 = auVar26 | auVar12;
  fVar23 = (cull_rect->Min).y;
  auVar28._4_4_ = -(uint)(fVar23 < auVar26._4_4_);
  auVar28._0_4_ = -(uint)((cull_rect->Min).x < auVar26._0_4_);
  auVar13._4_8_ = auVar26._8_8_;
  auVar13._0_4_ = -(uint)(auVar26._4_4_ < fVar23);
  auVar27._0_8_ = auVar13._0_8_ << 0x20;
  auVar27._8_4_ = -(uint)(auVar26._8_4_ < (cull_rect->Max).x);
  auVar27._12_4_ = -(uint)(auVar26._12_4_ < (cull_rect->Max).y);
  auVar28._8_8_ = auVar27._8_8_;
  iVar16 = movmskps((int)cull_rect,auVar28);
  if (iVar16 == 0xf) {
    IVar5 = this->Col;
    IVar3 = *uv;
    fVar23 = fVar18 - fVar22;
    fVar24 = fVar20 - fVar21;
    fVar25 = fVar23 * fVar23 + fVar24 * fVar24;
    if (0.0 < fVar25) {
      fVar25 = 1.0 / SQRT(fVar25);
      fVar23 = fVar23 * fVar25;
      fVar24 = fVar24 * fVar25;
    }
    fVar25 = this->Weight * 0.5;
    pIVar10 = DrawList->_VtxWritePtr;
    fVar23 = fVar25 * fVar23;
    fVar25 = fVar25 * fVar24;
    (pIVar10->pos).x = fVar25 + fVar22;
    (pIVar10->pos).y = fVar21 - fVar23;
    (pIVar10->uv).x = IVar3.x;
    (pIVar10->uv).y = IVar3.y;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar5;
    pIVar10[1].pos.x = fVar25 + fVar18;
    pIVar10[1].pos.y = fVar20 - fVar23;
    pIVar10[1].uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar5;
    pIVar10[2].pos.x = fVar18 - fVar25;
    pIVar10[2].pos.y = fVar20 + fVar23;
    pIVar10[2].uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar5;
    pIVar10[3].pos.x = fVar22 - fVar25;
    pIVar10[3].pos.y = fVar23 + fVar21;
    pIVar10[3].uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    pIVar11 = DrawList->_IdxWritePtr;
    IVar17 = (ImDrawIdx)uVar6;
    *pIVar11 = IVar17;
    pIVar11[1] = IVar17 + 1;
    pIVar11[2] = IVar17 + 2;
    pIVar11[3] = IVar17;
    pIVar11[4] = IVar17 + 2;
    pIVar11[5] = IVar17 + 3;
    DrawList->_IdxWritePtr = pIVar11 + 6;
    DrawList->_VtxCurrentIdx = uVar6 + 4;
  }
  return (char)iVar16 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }